

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool print_number(cJSON *item,printbuffer *output_buffer)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  lconv *plVar4;
  uchar *puVar5;
  cJSON_bool cVar6;
  ulong uVar7;
  uchar uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double test;
  uchar number_buffer [26];
  double local_50;
  uchar local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = localeconv();
  cVar6 = 0;
  if (item == (cJSON *)0x0) goto LAB_00105f69;
  uVar1 = *plVar4->decimal_point;
  if ((in_XMM0_Qa * 0.0 != 0.0) || (NAN(in_XMM0_Qa * 0.0))) {
    builtin_memcpy(local_48,"null",5);
    uVar2 = 4;
  }
  else {
    uVar2 = sprintf((char *)local_48,"%1.15g");
    iVar3 = __isoc99_sscanf(local_48,"%lg",&local_50);
    if (iVar3 == 1) {
      if ((local_50 != in_XMM0_Qa) || (NAN(local_50) || NAN(in_XMM0_Qa))) goto LAB_00105f03;
    }
    else {
LAB_00105f03:
      uVar2 = sprintf((char *)local_48,"%1.17g");
    }
    cVar6 = 0;
    if (0x19 < uVar2) goto LAB_00105f69;
  }
  uVar9 = (ulong)uVar2;
  puVar5 = ensure((printbuffer *)item,uVar9 + 1);
  cVar6 = 0;
  if (puVar5 != (uchar *)0x0) {
    if (uVar9 != 0) {
      uVar7 = 0;
      do {
        uVar8 = local_48[uVar7];
        if (local_48[uVar7] == uVar1) {
          uVar8 = '.';
        }
        puVar5[uVar7] = uVar8;
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    puVar5[uVar9] = '\0';
    item->child = (cJSON *)((long)&item->child->next + uVar9);
    cVar6 = 1;
  }
LAB_00105f69:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return cVar6;
  }
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_number(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    double d = item->valuedouble;
    int length = 0;
    size_t i = 0;
    unsigned char number_buffer[26]; /* temporary buffer to print the number into */
    unsigned char decimal_point = get_decimal_point();
    double test;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* This checks for NaN and Infinity */
    if ((d * 0) != 0)
    {
        length = sprintf((char*)number_buffer, "null");
    }
    else
    {
        /* Try 15 decimal places of precision to avoid nonsignificant nonzero digits */
        length = sprintf((char*)number_buffer, "%1.15g", d);

        /* Check whether the original double can be recovered */
        if ((sscanf((char*)number_buffer, "%lg", &test) != 1) || ((double)test != d))
        {
            /* If not, print with 17 decimal places of precision */
            length = sprintf((char*)number_buffer, "%1.17g", d);
        }
    }

    /* sprintf failed or buffer overrun occurred */
    if ((length < 0) || (length > (int)(sizeof(number_buffer) - 1)))
    {
        return false;
    }

    /* reserve appropriate space in the output */
    output_pointer = ensure(output_buffer, (size_t)length + sizeof(""));
    if (output_pointer == NULL)
    {
        return false;
    }

    /* copy the printed number to the output and replace locale
     * dependent decimal point with '.' */
    for (i = 0; i < ((size_t)length); i++)
    {
        if (number_buffer[i] == decimal_point)
        {
            output_pointer[i] = '.';
            continue;
        }

        output_pointer[i] = number_buffer[i];
    }
    output_pointer[i] = '\0';

    output_buffer->offset += (size_t)length;

    return true;
}